

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O2

bool __thiscall
MultiAgentDecisionProcessDiscrete::SanityCheck(MultiAgentDecisionProcessDiscrete *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ostream *poVar4;
  E *pEVar5;
  Index IVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  string local_228;
  string local_208;
  char float_str [30];
  stringstream ss;
  ostream local_1a8 [376];
  
  uVar1 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x70))();
  uVar2 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x30))(this);
  uVar3 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xd0))(this);
  uVar9 = 0;
  do {
    if (uVar1 <= uVar9) {
      uVar7 = 0;
      do {
        if (uVar2 <= uVar7) {
          return true;
        }
        for (uVar9 = 0; uVar10 = (ulong)uVar9, uVar10 < uVar1; uVar9 = uVar9 + 1) {
          for (uVar11 = 0; uVar12 = (ulong)uVar11, uVar12 < uVar2; uVar11 = uVar11 + 1) {
            dVar14 = 0.0;
            uVar8 = 0;
            while (IVar6 = (Index)uVar8, uVar8 < uVar3) {
              if (this->_m_eventObservability == true) {
                dVar13 = (double)(**(code **)(*(long *)&this->super_MultiAgentDecisionProcess +
                                             0x130))(this,uVar7,uVar10,uVar12,uVar8);
              }
              else {
                dVar13 = (double)(**(code **)(*(long *)&this->super_MultiAgentDecisionProcess +
                                             0x128))(this,uVar10,uVar12,uVar8);
              }
              if (dVar13 < 0.0) {
                std::__cxx11::stringstream::stringstream((stringstream *)&ss);
                poVar4 = std::operator<<(local_1a8,"MultiAgentDecisionProcessDiscrete::SanityCheck "
                                        );
                std::operator<<(poVar4,"failed: negative probability ");
                poVar4 = std::ostream::_M_insert<double>(dVar13);
                poVar4 = std::operator<<(poVar4," for p(o|s\',a)==p(");
                MADPComponentDiscreteObservations::GetJointObservationName_abi_cxx11_
                          (&local_208,&this->_m_O,IVar6);
                poVar4 = std::operator<<(poVar4,(string *)&local_208);
                poVar4 = std::operator<<(poVar4,"|");
                MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_228,&this->_m_S,uVar11);
                poVar4 = std::operator<<(poVar4,(string *)&local_228);
                poVar4 = std::operator<<(poVar4,",");
                MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                          ((string *)float_str,&this->_m_A,uVar9);
                poVar4 = std::operator<<(poVar4,(string *)float_str);
                std::operator<<(poVar4,")");
                std::__cxx11::string::~string((string *)float_str);
                std::__cxx11::string::~string((string *)&local_228);
                std::__cxx11::string::~string((string *)&local_208);
                pEVar5 = (E *)__cxa_allocate_exception(0x28);
                E::E(pEVar5,&ss);
                __cxa_throw(pEVar5,&E::typeinfo,E::~E);
              }
              if (NAN(dVar13)) {
                std::__cxx11::stringstream::stringstream((stringstream *)&ss);
                poVar4 = std::operator<<(local_1a8,"MultiAgentDecisionProcessDiscrete::SanityCheck "
                                        );
                poVar4 = std::operator<<(poVar4,"failed: NaN for p(o|s\',a)==p(");
                MADPComponentDiscreteObservations::GetJointObservationName_abi_cxx11_
                          (&local_208,&this->_m_O,IVar6);
                poVar4 = std::operator<<(poVar4,(string *)&local_208);
                poVar4 = std::operator<<(poVar4,"|");
                MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_228,&this->_m_S,uVar11);
                poVar4 = std::operator<<(poVar4,(string *)&local_228);
                poVar4 = std::operator<<(poVar4,",");
                MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                          ((string *)float_str,&this->_m_A,uVar9);
                poVar4 = std::operator<<(poVar4,(string *)float_str);
                std::operator<<(poVar4,")");
                std::__cxx11::string::~string((string *)float_str);
                std::__cxx11::string::~string((string *)&local_228);
                std::__cxx11::string::~string((string *)&local_208);
                pEVar5 = (E *)__cxa_allocate_exception(0x28);
                E::E(pEVar5,&ss);
                __cxa_throw(pEVar5,&E::typeinfo,E::~E);
              }
              dVar14 = dVar14 + dVar13;
              uVar8 = (ulong)(IVar6 + 1);
            }
            if ((1.0000000000005 < dVar14) || (dVar14 < 0.9999999999995)) {
              sprintf(float_str,"%10.10f",dVar14);
              std::__cxx11::stringstream::stringstream((stringstream *)&ss);
              poVar4 = std::operator<<(local_1a8,"MultiAgentDecisionProcessDiscrete::SanityCheck ");
              poVar4 = std::operator<<(poVar4,"failed: observation does not sum to 1 but to \n");
              poVar4 = std::operator<<(poVar4,float_str);
              poVar4 = std::operator<<(poVar4,"\n for (s\',a)==(");
              MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_208,&this->_m_S,uVar11);
              poVar4 = std::operator<<(poVar4,(string *)&local_208);
              poVar4 = std::operator<<(poVar4,"[");
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
              poVar4 = std::operator<<(poVar4,"],");
              MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                        (&local_228,&this->_m_A,uVar9);
              poVar4 = std::operator<<(poVar4,(string *)&local_228);
              poVar4 = std::operator<<(poVar4,"[");
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
              std::operator<<(poVar4,"])");
              std::__cxx11::string::~string((string *)&local_228);
              std::__cxx11::string::~string((string *)&local_208);
              pEVar5 = (E *)__cxa_allocate_exception(0x28);
              E::E(pEVar5,&ss);
              __cxa_throw(pEVar5,&E::typeinfo,E::~E);
            }
          }
        }
        uVar7 = (ulong)((int)uVar7 + 1);
        if (this->_m_eventObservability == false) {
          return true;
        }
      } while( true );
    }
    for (uVar11 = 0; uVar11 < uVar2; uVar11 = uVar11 + 1) {
      dVar14 = 0.0;
      uVar7 = 0;
      while (IVar6 = (Index)uVar7, uVar7 < uVar2) {
        dVar13 = (double)(**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))
                                   (this,(ulong)uVar11,(ulong)uVar9,uVar7);
        if (dVar13 < 0.0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar4 = std::operator<<(local_1a8,"MultiAgentDecisionProcessDiscrete::SanityCheck ");
          std::operator<<(poVar4,"failed: negative probability ");
          poVar4 = std::ostream::_M_insert<double>(dVar13);
          poVar4 = std::operator<<(poVar4," for p(s\'|s,a)==p(");
          MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_208,&this->_m_S,IVar6);
          poVar4 = std::operator<<(poVar4,(string *)&local_208);
          poVar4 = std::operator<<(poVar4,"|");
          MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_228,&this->_m_S,uVar11);
          poVar4 = std::operator<<(poVar4,(string *)&local_228);
          poVar4 = std::operator<<(poVar4,",");
          MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                    ((string *)float_str,&this->_m_A,uVar9);
          poVar4 = std::operator<<(poVar4,(string *)float_str);
          std::operator<<(poVar4,")");
          std::__cxx11::string::~string((string *)float_str);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::string::~string((string *)&local_208);
          pEVar5 = (E *)__cxa_allocate_exception(0x28);
          E::E(pEVar5,&ss);
          __cxa_throw(pEVar5,&E::typeinfo,E::~E);
        }
        if (NAN(dVar13)) {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar4 = std::operator<<(local_1a8,"MultiAgentDecisionProcessDiscrete::SanityCheck ");
          poVar4 = std::operator<<(poVar4,"failed: NaN ");
          poVar4 = std::operator<<(poVar4," for p(s\'|s,a)==p(");
          MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_208,&this->_m_S,IVar6);
          poVar4 = std::operator<<(poVar4,(string *)&local_208);
          poVar4 = std::operator<<(poVar4,"|");
          MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_228,&this->_m_S,uVar11);
          poVar4 = std::operator<<(poVar4,(string *)&local_228);
          poVar4 = std::operator<<(poVar4,",");
          MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                    ((string *)float_str,&this->_m_A,uVar9);
          poVar4 = std::operator<<(poVar4,(string *)float_str);
          std::operator<<(poVar4,")");
          std::__cxx11::string::~string((string *)float_str);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::string::~string((string *)&local_208);
          pEVar5 = (E *)__cxa_allocate_exception(0x28);
          E::E(pEVar5,&ss);
          __cxa_throw(pEVar5,&E::typeinfo,E::~E);
        }
        dVar14 = dVar14 + dVar13;
        uVar7 = (ulong)(IVar6 + 1);
      }
      if ((1.0000000000005 < dVar14) || (dVar14 < 0.9999999999995)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        sprintf(float_str,"%10.10f",dVar14);
        poVar4 = std::operator<<(local_1a8,"MultiAgentDecisionProcessDiscrete::SanityCheck failed:")
        ;
        poVar4 = std::operator<<(poVar4," transition does not sum to 1 but to:\n");
        poVar4 = std::operator<<(poVar4,float_str);
        poVar4 = std::operator<<(poVar4,"\n for (s,a)==(");
        MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_208,&this->_m_S,uVar11);
        poVar4 = std::operator<<(poVar4,(string *)&local_208);
        poVar4 = std::operator<<(poVar4,"[");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,"],");
        MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_(&local_228,&this->_m_A,uVar9);
        poVar4 = std::operator<<(poVar4,(string *)&local_228);
        poVar4 = std::operator<<(poVar4,"[");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4,"])");
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_208);
        pEVar5 = (E *)__cxa_allocate_exception(0x28);
        E::E(pEVar5,&ss);
        __cxa_throw(pEVar5,&E::typeinfo,E::~E);
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

bool MultiAgentDecisionProcessDiscrete::SanityCheck()
{
    size_t nrJA=GetNrJointActions(),
          nrS=GetNrStates(),
          nrJO=GetNrJointObservations();

    double sum,p;
    bool sane=true;

    // check transition model
    for(Index a=0;a<nrJA;a++)
    {
        for(Index from=0;from<nrS;from++)
        {
            sum=0.0;
            for(Index to=0;to<nrS;to++)
            {
                p=GetTransitionProbability(from,a,to);
                if(p<0)
                {
                    sane=false;
                    stringstream ss;
                    ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "<<
                        "failed: negative probability " << p << 
                        " for p(s'|s,a)==p(" << _m_S.GetStateName(to) << "|" << 
                        _m_S.GetStateName(from)<<"," << _m_A.GetJointActionName(a) << ")";
                    throw E(ss);
                }
                if(std::isnan(p))
                {
                    sane=false;
                    stringstream ss;
                    ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "<<
                        "failed: NaN " << 
                        " for p(s'|s,a)==p(" << _m_S.GetStateName(to) << "|" << 
                        _m_S.GetStateName(from)<<"," << _m_A.GetJointActionName(a) << ")";
                    throw E(ss);
                }
                sum+=p;
            }
            if((sum>(1.0 + PROB_PRECISION/2)) ||
               (sum < (1.0 - PROB_PRECISION/2)))
            {
                sane=false;
                stringstream ss;
                //string float_str;
                char float_str[30];
                sprintf(float_str, "%10.10f", sum);
                ss << "MultiAgentDecisionProcessDiscrete::SanityCheck failed:"<<
                   " transition does not sum to 1 but to:\n" << float_str << 
                   "\n for (s,a)==(" << _m_S.GetStateName(from) << "[" << from << 
                   "]," << _m_A.GetJointActionName(a) << "[" << a << "])";
                throw E(ss);
            }
        }
    }

    // check observation model

    for(Index from=0;from<nrS;from++)
    {
      for(Index a=0;a<nrJA;a++)
      {
        for(Index to=0;to<nrS;to++)
        {
            sum=0;
            for(Index o=0;o<nrJO;o++)
            {
	        if(_m_eventObservability)
	            p=GetObservationProbability(from,a,to,o);
		else
		    p=GetObservationProbability(a,to,o);
                if(p<0)
                {
                    stringstream ss;
                    ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "
                       << "failed: negative probability " << p 
                       << " for p(o|s',a)==p(" 
                       << _m_O.GetJointObservationName(o)
                       << "|" << _m_S.GetStateName(to) 
                       << "," 
                       << _m_A.GetJointActionName(a) 
                       << ")";
                    throw E(ss);
                }
                if(std::isnan(p))
                {
                    stringstream ss;
                    ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "
                       << "failed: NaN for p(o|s',a)==p(" 
                       << _m_O.GetJointObservationName(o)
                       << "|" << _m_S.GetStateName(to) 
                       << "," 
                       << _m_A.GetJointActionName(a) 
                       << ")";
                    throw E(ss);
                }
                sum+=p;
            }
            if((sum>(1.0 + PROB_PRECISION/2)) ||
               (sum < (1.0 - PROB_PRECISION/2)))
            {
                char float_str[30];
                sprintf(float_str, "%10.10f", sum);
                sane=false;
                stringstream ss;
                ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "
                   << "failed: observation does not sum to 1 but to \n" 
                   << float_str << "\n for (s',a)==(" << _m_S.GetStateName(to) 
                   << "[" << to << "],"
                   << _m_A.GetJointActionName(a) 
                   << "[" << a << "])";
                throw E(ss);
            }
        }
      }
      if(!_m_eventObservability) break;
    }

    return(sane);
}